

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execShiftRg<(moira::Core)2,(moira::Instr)11,(moira::Mode)0,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  this->cp = 0;
  cnt = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode >> 9 & 7) * 4) & 0x3f;
  prefetch<(moira::Core)2,4ull>(this);
  uVar1 = shift<(moira::Core)2,(moira::Instr)11,4>
                    (this,cnt,(ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4)
                    );
  *(u32 *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = uVar1;
  (*this->_vptr_Moira[2])(this,(ulong)(cnt + this->cp + 6));
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    int cnt = readD(src) & 0x3F;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(  8 + cnt );
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES( 12 + cnt );
                break;
                
            default:
                
                CYCLES(  6 + cnt );
                break;
        }
    }

    FINALIZE
}